

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::TreeEnsembleRegressor::MergePartialFromCodedStream
          (TreeEnsembleRegressor *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  ulong uVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  TreeEnsembleParameters *pTVar8;
  pair<int,_int> pVar9;
  int iVar10;
  int byte_limit;
  ulong uVar11;
  ulong unaff_R12;
  
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_004dca72;
      input->buffer_ = pbVar2 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_004dca72:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar6 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) {
LAB_004dcb11:
      iVar10 = 7;
      if ((uVar6 & 7) != 4 && uVar6 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
        if (bVar5) goto LAB_004dcb36;
        iVar10 = 6;
      }
    }
    else {
      uVar7 = (uint)(uVar11 >> 3) & 0x1fffffff;
      if (uVar7 != 2) {
        if ((uVar7 != 1) || ((char)uVar11 != '\n')) goto LAB_004dcb11;
        if (this->treeensemble_ == (TreeEnsembleParameters *)0x0) {
          pTVar8 = (TreeEnsembleParameters *)operator_new(0x50);
          TreeEnsembleParameters::TreeEnsembleParameters(pTVar8);
          this->treeensemble_ = pTVar8;
        }
        pTVar8 = this->treeensemble_;
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < (char)*puVar3))
        {
          input->buffer_ = puVar3 + 1;
          bVar5 = true;
        }
        else {
          byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar5 = -1 < byte_limit;
        }
        iVar10 = 6;
        if (bVar5) {
          unaff_R12 = unaff_R12 & 0xffffffff;
          pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,byte_limit);
          if (((-1 < (long)pVar9) &&
              (bVar5 = TreeEnsembleParameters::MergePartialFromCodedStream(pTVar8,input), bVar5)) &&
             (bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                                (input,pVar9.first), bVar5)) goto LAB_004dcb36;
        }
        goto LAB_004dcb38;
      }
      if ((char)uVar11 != '\x10') goto LAB_004dcb11;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar11 = (ulong)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_004dcbaf;
        input->buffer_ = pbVar2 + 1;
        bVar5 = true;
      }
      else {
        uVar6 = 0;
LAB_004dcbaf:
        uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        bVar5 = -1 < (long)uVar11;
      }
      uVar4 = unaff_R12;
      if (bVar5) {
        uVar4 = uVar11;
      }
      unaff_R12 = uVar4 & 0xffffffff;
      if (!bVar5) {
        iVar10 = 6;
      }
      else {
        this->postevaluationtransform_ = (int)uVar4;
LAB_004dcb36:
        iVar10 = 0;
      }
    }
LAB_004dcb38:
    if (iVar10 != 0) {
      return iVar10 != 6;
    }
  } while( true );
}

Assistant:

bool TreeEnsembleRegressor::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleRegressor)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensemble()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_postevaluationtransform(static_cast< ::CoreML::Specification::TreeEnsemblePostEvaluationTransform >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleRegressor)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleRegressor)
  return false;
#undef DO_
}